

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
mocker::anon_unknown_6::FindPureFunctions::operator()(FindPureFunctions *this,IfStmt *node)

{
  bool bVar1;
  shared_ptr<mocker::ast::ASTNode> local_58;
  shared_ptr<mocker::ast::ASTNode> local_48 [2];
  shared_ptr<mocker::ast::ASTNode> local_28;
  IfStmt *local_18;
  IfStmt *node_local;
  FindPureFunctions *this_local;
  
  local_18 = node;
  node_local = (IfStmt *)this;
  std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Expression,void>
            (&local_28,&node->condition);
  visit(this,&local_28);
  std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_28);
  std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Statement,void>
            (local_48,&local_18->then);
  visit(this,local_48);
  std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(local_48);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_18->else_);
  if (bVar1) {
    std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Statement,void>
              (&local_58,&local_18->else_);
    visit(this,&local_58);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_58);
  }
  return;
}

Assistant:

void operator()(const ast::IfStmt &node) const override {
    visit(node.condition);
    visit(node.then);
    if (node.else_)
      visit(node.else_);
  }